

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

void __thiscall soplex::CLUFactor<double>::forestPackColumns(CLUFactor<double> *this)

{
  Col *pCVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  pointer pdVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  Dring *pDVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  
  pCVar1 = &(this->u).col;
  pDVar9 = (this->u).col.list.next;
  piVar4 = (this->u).col.max;
  if ((Col *)pDVar9 == pCVar1) {
    uVar11 = 0;
  }
  else {
    pdVar5 = (this->u).col.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (this->u).col.idx;
    piVar7 = (this->u).col.len;
    piVar8 = (this->u).col.start;
    uVar12 = 0;
    do {
      iVar2 = pDVar9->idx;
      if (piVar8[iVar2] != (int)uVar12) goto LAB_001e0281;
      uVar11 = (int)uVar12 + piVar7[iVar2];
      uVar12 = (ulong)uVar11;
      piVar4[iVar2] = piVar7[iVar2];
      pDVar9 = pDVar9->next;
    } while ((Col *)pDVar9 != pCVar1);
  }
LAB_001e02d0:
  (this->u).col.used = uVar11;
  piVar4[this->thedim] = 0;
  return;
LAB_001e0281:
  do {
    iVar2 = pDVar9->idx;
    iVar3 = piVar8[iVar2];
    lVar10 = (long)iVar3;
    piVar8[iVar2] = (int)uVar12;
    piVar4[iVar2] = piVar7[iVar2];
    iVar2 = piVar7[iVar2];
    if (0 < iVar2) {
      uVar12 = (ulong)(int)uVar12;
      do {
        pdVar5[uVar12] = pdVar5[lVar10];
        piVar6[uVar12] = piVar6[lVar10];
        uVar12 = uVar12 + 1;
        lVar10 = lVar10 + 1;
      } while (lVar10 < iVar2 + iVar3);
    }
    uVar11 = (uint)uVar12;
    pDVar9 = pDVar9->next;
  } while ((Col *)pDVar9 != pCVar1);
  goto LAB_001e02d0;
}

Assistant:

void CLUFactor<R>::forestPackColumns()
{
   int n, i, j, colno;
   Dring* ring, *list;

   R* cval = u.col.val.data();
   int* cidx = u.col.idx;
   int* clen = u.col.len;
   int* cmax = u.col.max;
   int* cbeg = u.col.start;

   n = 0;
   list = &u.col.list;

   for(ring = list->next; ring != list; ring = ring->next)
   {
      colno = ring->idx;

      if(cbeg[colno] != n)
      {
         do
         {
            colno = ring->idx;
            i = cbeg[colno];
            cbeg[colno] = n;
            cmax[colno] = clen[colno];
            j = i + clen[colno];

            for(; i < j; ++i)
            {
               cval[n] = cval[i];
               cidx[n++] = cidx[i];
            }

            ring = ring->next;
         }
         while(ring != list);

         goto terminatePackColumns;
      }

      n += clen[colno];

      cmax[colno] = clen[colno];
   }

terminatePackColumns :

   u.col.used = n;
   u.col.max[thedim] = 0;
}